

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O3

void __thiscall
cfd::ConfidentialTransactionContext::SplitTxOut
          (ConfidentialTransactionContext *this,uint32_t index,
          vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *amount_list,
          vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *address_list)

{
  pointer pAVar1;
  pointer pAVar2;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> locking_script_list;
  vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> nonce_list;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> local_a8;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *local_88;
  vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> local_80;
  Script local_68;
  
  local_a8.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88 = amount_list;
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::vector
            (&local_80,
             ((long)(address_list->
                    super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(address_list->
                    super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) * 0x51b3bea3677d46cf,
             (allocator_type *)&local_68);
  pAVar2 = (address_list->
           super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pAVar1 = (address_list->
           super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pAVar2 != pAVar1) {
    do {
      cfd::core::Address::GetLockingScript();
      std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::
      emplace_back<cfd::core::Script>(&local_a8,&local_68);
      core::Script::~Script(&local_68);
      pAVar2 = pAVar2 + 0x178;
    } while (pAVar2 != pAVar1);
  }
  SplitTxOut(this,index,local_88,&local_a8,&local_80);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::~vector
            (&local_80);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::~vector(&local_a8);
  return;
}

Assistant:

void ConfidentialTransactionContext::SplitTxOut(
    uint32_t index, const std::vector<Amount>& amount_list,
    const std::vector<Address>& address_list) {
  std::vector<Script> locking_script_list;
  std::vector<ConfidentialNonce> nonce_list(address_list.size());
  for (const auto& addr : address_list) {
    locking_script_list.emplace_back(addr.GetLockingScript());
  }
  SplitTxOut(index, amount_list, locking_script_list, nonce_list);
}